

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86regalloc.cpp
# Opt level: O1

Error __thiscall asmjit::X86RAPass::translate(X86RAPass *this)

{
  CBNode **ppCVar1;
  uint32_t *puVar2;
  byte *pbVar3;
  byte bVar4;
  ushort uVar5;
  long *plVar6;
  CodeBuilder *pCVar7;
  RegOrder RVar8;
  CBNode *node_00;
  bool bVar9;
  char cVar10;
  char extraout_AL;
  int iVar11;
  X86RAData *raData;
  uint uVar12;
  Error EVar13;
  undefined4 extraout_var;
  long lVar14;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  CCFunc *pCVar15;
  CBNode *pCVar16;
  CodeCompiler *node_01;
  ulong uVar17;
  uint uVar18;
  char *in_RCX;
  void *pvVar19;
  uint32_t typeId;
  long extraout_RDX;
  CodeBuilder *pCVar20;
  CCFunc *in_RSI;
  CCFunc *node_02;
  CodeCompiler *this_00;
  uint *this_01;
  long lVar21;
  ulong in_R8;
  ulong in_R9;
  CCFunc *unaff_R12;
  CCFunc *pCVar22;
  CBLabel *node;
  CCFunc *pCVar23;
  CCFunc *unaff_R15;
  undefined8 extraout_XMM1_Qa;
  undefined8 uVar24;
  X86Mem m;
  X86CallAlloc cAlloc;
  X86VarAlloc vAlloc;
  __va_list_tag _Stack_298;
  undefined1 auStack_278 [32];
  ulong uStack_258;
  ulong uStack_250;
  undefined8 uStack_238;
  X86RAPass *pXStack_1c8;
  CBNode *pCStack_1c0;
  anon_union_16_7_ed616b9d_for_Operand__0 aStack_1b8;
  X86RAPass *pXStack_1a8;
  CCFunc *pCStack_1a0;
  CCFunc *pCStack_198;
  CCFunc *pCStack_190;
  CCFunc *pCStack_188;
  CodeBuilder *pCStack_180;
  uint local_174;
  CBLabel *local_170;
  CCFunc *local_168;
  CBLabel *local_160;
  X86RAPass *local_158;
  void *local_150;
  CCFunc *local_148;
  CCFunc *local_140;
  CodeBuilder *local_138;
  anon_union_16_7_ed616b9d_for_Operand__0 local_130;
  int32_t local_114;
  int local_10c;
  X86CallAlloc local_f0;
  X86RAPass *local_90;
  CodeBuilder *local_88;
  
  pCVar20 = (this->super_RAPass).super_CBPass._cb;
  local_168 = (this->super_RAPass)._func;
  local_148 = (CCFunc *)(this->super_RAPass)._stop;
  pCVar23 = (CCFunc *)(this->super_RAPass)._jccList._first;
  node_02 = local_168;
  local_f0.super_X86BaseAlloc._context = this;
  local_f0.super_X86BaseAlloc._cc = (X86Compiler *)pCVar20;
  local_90 = this;
  local_88 = pCVar20;
LAB_00132925:
  if (((((CBInst *)&node_02->super_CBLabel)->super_CBNode)._flags & 1) == 0) goto LAB_00132958;
  pCVar22 = unaff_R12;
  if ((((CBInst *)&node_02->super_CBLabel)->super_CBNode)._type == '\x04') {
    pCVar20->_cursor = (((CBInst *)&node_02->super_CBLabel)->super_CBNode)._prev;
    in_RSI = *(CCFunc **)((long)(((CBInst *)&node_02->super_CBLabel)->super_CBNode)._passData + 8);
    pCStack_180 = (CodeBuilder *)0x132953;
    (*(this->super_RAPass).super_CBPass._vptr_CBPass[8])(this);
  }
switchD_00132997_caseD_7:
  pCVar15 = pCVar23;
  do {
    if (pCVar15 == (CCFunc *)0x0) {
      pCStack_180 = (CodeBuilder *)0x132e33;
      this_01 = (uint *)this;
      uVar12 = (*(this->super_RAPass).super_CBPass._vptr_CBPass[10])();
      pCVar23 = local_168;
      uVar18 = local_174;
      if (uVar12 != 0) {
        uVar18 = uVar12;
      }
      unaff_R15 = (CCFunc *)(ulong)uVar18;
      if (uVar12 != 0) {
        return uVar18;
      }
      (local_168->_frameInfo)._dirtyRegs[0] = (uint)(this->_clobberedRegs).field_0.field_0._gp;
      (local_168->_frameInfo)._dirtyRegs[2] = (uint)(this->_clobberedRegs).field_0.field_0._mm;
      (local_168->_frameInfo)._dirtyRegs[3] = (uint)(this->_clobberedRegs).field_0.field_0._k;
      (local_168->_frameInfo)._dirtyRegs[1] = (this->_clobberedRegs).field_0.field_0._vec;
      (local_168->_frameInfo)._stackFrameSize = (this->super_RAPass)._memAllTotal;
      uVar18 = (this->super_RAPass)._memMaxAlign;
      if (0xff < uVar18) goto LAB_00133021;
      (local_168->_frameInfo)._stackFrameAlignment = (uint8_t)uVar18;
      pCStack_180 = (CodeBuilder *)0x132eba;
      EVar13 = FuncFrameLayout::init
                         ((FuncFrameLayout *)&local_130._any,(EVP_PKEY_CTX *)&local_168->_funcDetail
                         );
      if (EVar13 != 0) {
        return EVar13;
      }
      this->_varBaseRegId = local_130._any.signature._1_1_;
      this->_varBaseOffset = local_114;
      pCVar7 = (this->super_RAPass).super_CBPass._cb;
      in_RCX = (char *)0xf8;
      pCVar15 = pCVar23;
      goto LAB_00132eeb;
    }
    pCVar23 = (CCFunc *)(((CBInst *)&pCVar15->super_CBLabel)->super_CBNode)._prev;
    pCVar22 = (CCFunc *)(((CBInst *)&pCVar15->super_CBLabel)->super_CBNode)._next;
    uVar17 = (ulong)(((((CBInst *)&pCVar22->super_CBLabel)->super_CBNode)._flags & 0x40) == 0);
    in_RCX = (char *)(uVar17 * 0x40);
    node_02 = *(CCFunc **)
               ((long)&((CBInst *)&pCVar22->super_CBLabel)->super_CBNode + uVar17 * 0x40 + 8);
    in_RSI = *(CCFunc **)((long)(((CBInst *)&pCVar22->super_CBLabel)->super_CBNode)._passData + 8);
    pCStack_180 = (CodeBuilder *)0x132df5;
    (*(this->super_RAPass).super_CBPass._vptr_CBPass[6])(this);
    pvVar19 = (((CBInst *)&node_02->super_CBLabel)->super_CBNode)._passData;
    if ((pvVar19 == (void *)0x0) || (*(long *)((long)pvVar19 + 8) == 0)) break;
    pCStack_180 = (CodeBuilder *)0x132e1b;
    in_RSI = pCVar22;
    X86RAPass_translateJump(this,(CBJump *)pCVar22,&node_02->super_CBLabel);
    pCVar15 = pCVar23;
  } while (((((CBInst *)&node_02->super_CBLabel)->super_CBNode)._flags & 1) != 0);
LAB_00132958:
  unaff_R12 = (CCFunc *)(node_02->super_CBLabel).super_CBNode._next;
  pvVar19 = (node_02->super_CBLabel).super_CBNode._passData;
  uVar5 = (node_02->super_CBLabel).super_CBNode._flags;
  uVar18 = uVar5 | 1;
  in_RCX = (char *)(ulong)uVar18;
  (node_02->super_CBLabel).super_CBNode._flags = (uint16_t)uVar18;
  if (pvVar19 != (void *)0x0) {
    bVar4 = (node_02->super_CBLabel).super_CBNode._type;
    in_RCX = (char *)(ulong)bVar4;
    pCVar15 = (CCFunc *)(ulong)(bVar4 - 1);
    in_RSI = pCVar15;
    if (0x13 < bVar4 - 1) goto switchD_00132997_caseD_1;
    this_01 = &switchD_00132997::switchdataD_0014359c;
    in_RSI = (CCFunc *)
             ((long)&switchD_00132997::switchdataD_0014359c +
             (long)(int)(&switchD_00132997::switchdataD_0014359c)[(long)pCVar15]);
    pCVar22 = unaff_R12;
    switch(pCVar15) {
    case (CCFunc *)0x0:
    case (CCFunc *)0xf:
    case (CCFunc *)0x11:
    case (CCFunc *)0x12:
      if ((((unaff_R12 != (CCFunc *)0x0 && (uVar5 & 0x20) == 0) &&
           (plVar6 = (long *)(((CBInst *)&unaff_R12->super_CBLabel)->super_CBNode)._passData,
           plVar6 != (long *)0x0)) && (lVar14 = *plVar6, lVar14 != 0)) &&
         (uVar18 = *(uint *)((long)pvVar19 + 0x10), (ulong)uVar18 != 0)) {
        lVar21 = 0;
        do {
          in_R8 = *(ulong *)((long)pvVar19 + lVar21 + 0x38);
          in_R9 = (ulong)*(uint *)(in_R8 + 0x18);
          if (((*(ulong *)(lVar14 + (ulong)(*(uint *)(in_R8 + 0x18) >> 6) * 8) >> (in_R9 & 0x3f) & 1
               ) == 0) && ((*(byte *)(in_R8 + 0x17) & 1) == 0)) {
            pbVar3 = (byte *)((long)pvVar19 + lVar21 + 0x41);
            *pbVar3 = *pbVar3 | 0x10;
          }
          lVar21 = lVar21 + 0x18;
        } while ((ulong)uVar18 * 0x18 != lVar21);
      }
      if (bVar4 != 0x12) goto switchD_00132997_caseD_10;
      pCStack_180 = (CodeBuilder *)0x132a17;
      X86CallAlloc::run(&local_f0,(CCFuncCall *)node_02);
      in_RSI = node_02;
      break;
    case (CCFunc *)0x3:
      if (*(long *)((long)pvVar19 + 8) != 0) goto LAB_0013303a;
      pCStack_180 = (CodeBuilder *)0x132c47;
      iVar11 = (*(this->super_RAPass).super_CBPass._vptr_CBPass[7])(this);
      in_RCX = (char *)(node_02->super_CBLabel).super_CBNode._passData;
      *(ulong *)(in_RCX + 8) = CONCAT44(extraout_var_00,iVar11);
      if (node_02 == (CCFunc *)local_168->_exitNode) goto switchD_00132997_caseD_7;
      break;
    case (CCFunc *)0x7:
      goto switchD_00132997_caseD_7;
    case (CCFunc *)0x10:
    case (CCFunc *)0x13:
switchD_00132997_caseD_10:
      this_01 = (uint *)&stack0xffffffffffffff70;
      pCStack_180 = (CodeBuilder *)0x132a2c;
      in_RSI = node_02;
      X86VarAlloc::run((X86VarAlloc *)this_01,(CBNode *)node_02);
      uVar5 = (node_02->super_CBLabel).super_CBNode._flags;
      if ((uVar5 & 0x30) == 0) {
        if ((char)uVar5 < '\0') {
          local_160 = local_168->_exitNode;
          local_158 = (X86RAPass *)(this->super_RAPass).super_CBPass._cb;
          local_170 = (CBLabel *)(node_02->super_CBLabel).super_CBNode._next;
          pvVar19 = (node_02->super_CBLabel).super_CBNode._passData;
          local_138 = pCVar20;
          local_140 = unaff_R12;
          if ((pvVar19 != (void *)0x0) && ((ulong)*(uint *)((long)pvVar19 + 0x10) != 0)) {
            pCVar20 = (CodeBuilder *)((ulong)*(uint *)((long)pvVar19 + 0x10) * 0x18);
            pCVar22 = (CCFunc *)0x0;
            local_150 = pvVar19;
LAB_00132aea:
            if (*(uint *)((long)(pCVar22->_funcDetail)._callConv._passedOrder + (long)pvVar19) <
                0x40000000) goto LAB_00132bb6;
            unaff_R15 = *(CCFunc **)
                         ((long)(pCVar22->_funcDetail)._callConv._passedOrder + (long)pvVar19 + -8);
            if (*(RACell **)&((CBInst *)&unaff_R15->super_CBLabel)->_instId == (RACell *)0x0) {
              pCStack_180 = (CodeBuilder *)0x132b10;
              in_RSI = unaff_R15;
              this_01 = (uint *)this;
              RAPass::_newVarCell(&this->super_RAPass,(VirtReg *)unaff_R15);
            }
            local_130._packed[0] =
                 (UInt64)((ulong)((((this->super_RAPass).super_CBPass._cb)->super_CodeEmitter).
                                  _nativeGpReg.super_Operand.super_Operand_.field_0._any.signature &
                                 0xf8) | 0xffffffff00008002);
            uVar18 = *(uint *)&(((CBInst *)&unaff_R15->super_CBLabel)->super_CBNode)._prev;
            in_RCX = (char *)(ulong)uVar18;
            local_130._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)((ulong)uVar18 << 0x20);
            lVar14 = (long)(char)(uint8_t)(((CBInst *)&unaff_R15->super_CBLabel)->super_CBNode).
                                          _position;
            if (-1 < lVar14) {
              if (TypeId::_info[lVar14 + 0x80] == '*') {
                uVar18 = 0x4000000;
              }
              else if (TypeId::_info[lVar14 + 0x80] == '+') {
                uVar18 = 0x8000000;
              }
              else {
                uVar18 = (uint)(((pCVar22->_funcDetail)._callConv._passedOrder[0].id
                                 [(long)local_150 + 3] & 0x40) == 0) * 0x4000000 + 0x4000000;
              }
              local_130._any.id = 0xffffffff;
              local_130._any.signature = local_130._any.signature | uVar18;
              in_RSI = (CCFunc *)0xc6;
              pCStack_180 = (CodeBuilder *)0x132bb1;
              this_01 = (uint *)local_158;
              CodeEmitter::emit((CodeEmitter *)local_158,0xc6,(Operand_ *)&local_130._any);
              pvVar19 = local_150;
              goto LAB_00132bb6;
            }
            pCStack_180 = (CodeBuilder *)0x133021;
            translate();
LAB_00133021:
            pCStack_180 = (CodeBuilder *)0x133026;
            translate();
            goto LAB_00133026;
          }
joined_r0x00132bd3:
          do {
            pCVar20 = local_138;
            unaff_R12 = local_140;
            if (local_170 == (CBLabel *)0x0) goto LAB_00132d61;
            bVar4 = (local_170->super_CBNode)._type;
            if (bVar4 < 8) {
              if (bVar4 - 1 < 2) goto LAB_00132d61;
              if (bVar4 == 4) {
                uVar18 = 0;
                bVar9 = true;
                if (local_170 == local_160) goto LAB_00132d9e;
                goto LAB_00132d61;
              }
            }
            else {
              if (bVar4 - 0x11 < 2) goto LAB_00132d61;
              if (bVar4 == 8) goto LAB_00132d9a;
              if (bVar4 == 0x10) {
                uVar18 = 4;
                bVar9 = false;
                goto LAB_00132d9e;
              }
            }
            local_170 = (CBLabel *)(local_170->super_CBNode)._next;
          } while( true );
        }
      }
      else {
        unaff_R15 = *(CCFunc **)(node_02->_funcDetail)._callConv._passedOrder[1].id;
        if (unaff_R15 == (CCFunc *)0x0) {
          cVar10 = (char)((uVar5 & 0x10) >> 4);
          unaff_R15 = unaff_R12;
        }
        else if ((uVar5 & 0x10) == 0) {
          unaff_R12 = (CCFunc *)(node_02->super_CBLabel).super_CBNode._next;
          uVar5 = (((CBInst *)&unaff_R12->super_CBLabel)->super_CBNode)._flags;
          pCVar22 = unaff_R12;
          if (((((CBInst *)&unaff_R15->super_CBLabel)->super_CBNode)._flags & 1) == 0) {
            if ((uVar5 & 1) == 0) {
              pCStack_180 = (CodeBuilder *)0x132a70;
              iVar11 = (*(this->super_RAPass).super_CBPass._vptr_CBPass[7])(this);
              in_RCX = (char *)(node_02->super_CBLabel).super_CBNode._passData;
              *(ulong *)(in_RCX + 8) = CONCAT44(extraout_var,iVar11);
              if (((node_02->super_CBLabel).super_CBNode._flags & 0x40) == 0) {
                unaff_R15 = (CCFunc *)(node_02->super_CBLabel).super_CBNode._next;
              }
              else {
                unaff_R15 = *(CCFunc **)(node_02->_funcDetail)._callConv._passedOrder[1].id;
              }
            }
            else {
              if ((((CBInst *)&unaff_R12->super_CBLabel)->super_CBNode)._type != '\x04')
              goto LAB_00133044;
              pCStack_180 = (CodeBuilder *)0x132d1d;
              iVar11 = (*(this->super_RAPass).super_CBPass._vptr_CBPass[7])(this);
              in_RCX = (char *)(node_02->super_CBLabel).super_CBNode._passData;
              *(ulong *)(in_RCX + 8) = CONCAT44(extraout_var_02,iVar11);
              pCVar20->_cursor = (CBNode *)node_02;
              in_RSI = *(CCFunc **)
                        ((long)(((CBInst *)&unaff_R12->super_CBLabel)->super_CBNode)._passData + 8);
              pCStack_180 = (CodeBuilder *)0x132d3e;
              (*(this->super_RAPass).super_CBPass._vptr_CBPass[8])(this);
            }
            cVar10 = '\0';
          }
          else {
            if ((uVar5 & 1) != 0) {
              if ((((CBInst *)&unaff_R12->super_CBLabel)->super_CBNode)._type != '\x04')
              goto LAB_0013303f;
              pCVar20->_cursor = (node_02->super_CBLabel).super_CBNode._prev;
              pCStack_180 = (CodeBuilder *)0x132cd4;
              (*(this->super_RAPass).super_CBPass._vptr_CBPass[9])
                        (this,*(undefined8 *)
                               ((long)(((CBInst *)&unaff_R15->super_CBLabel)->super_CBNode).
                                      _passData + 8),
                         *(undefined8 *)
                          ((long)(((CBInst *)&unaff_R12->super_CBLabel)->super_CBNode)._passData + 8
                          ));
            }
            pCStack_180 = (CodeBuilder *)0x132cdd;
            iVar11 = (*(this->super_RAPass).super_CBPass._vptr_CBPass[7])(this);
            in_RCX = (char *)(node_02->super_CBLabel).super_CBNode._passData;
            *(ulong *)(in_RCX + 8) = CONCAT44(extraout_var_01,iVar11);
            pCStack_180 = (CodeBuilder *)0x132cf3;
            in_RSI = node_02;
            X86RAPass_translateJump(this,(CBJump *)node_02,&unaff_R15->super_CBLabel);
            cVar10 = '\0';
            unaff_R15 = unaff_R12;
          }
        }
        else {
          in_RCX = (char *)(((CBInst *)&unaff_R15->super_CBLabel)->super_CBNode)._passData;
          cVar10 = '\0';
          if (in_RCX != (char *)0x0) {
            in_RSI = *(CCFunc **)(in_RCX + 8);
            cVar10 = '\0';
            if (in_RSI != (CCFunc *)0x0) {
              pCVar20->_cursor = (node_02->super_CBLabel).super_CBNode._prev;
              pCStack_180 = (CodeBuilder *)0x132c9b;
              (*(this->super_RAPass).super_CBPass._vptr_CBPass[8])(this);
              cVar10 = '\x01';
              unaff_R15 = unaff_R12;
            }
          }
        }
        unaff_R12 = unaff_R15;
        unaff_R15 = unaff_R12;
        if (cVar10 != '\0') goto switchD_00132997_caseD_7;
      }
    }
  }
  goto switchD_00132997_caseD_1;
LAB_00132eeb:
  if (((((CBInst *)&pCVar15->super_CBLabel)->super_CBNode)._type == '\x01') &&
     (bVar4 = ((CBInst *)&pCVar15->super_CBLabel)->_memOpIndex, bVar4 != 0xff)) {
    RVar8 = (pCVar15->_funcDetail)._callConv._passedOrder[0];
    in_RSI = (CCFunc *)((long)RVar8 + (ulong)bVar4 * 0x10);
    uVar18 = *(uint *)((long)RVar8 + (ulong)bVar4 * 0x10);
    if ((uVar18 >> 0xe & 1) != 0) {
      ppCVar1 = &(((CBInst *)&in_RSI->super_CBLabel)->super_CBNode)._next;
      *(int *)ppCVar1 = *(int *)ppCVar1 + local_10c;
      *(uint *)&(((CBInst *)&in_RSI->super_CBLabel)->super_CBNode)._prev = uVar18 & 0xffffbfff;
    }
    uVar18 = *(uint *)&(((CBInst *)&in_RSI->super_CBLabel)->super_CBNode)._prev;
    this_01 = (uint *)(ulong)uVar18;
    if ((short)uVar18 < 0) {
      uVar12 = *(uint *)((long)&(((CBInst *)&in_RSI->super_CBLabel)->super_CBNode)._next + 4);
      in_R8 = (ulong)uVar12;
      if (0xff < uVar12) {
        if (uVar12 == 0xffffffff) {
LAB_00133026:
          pCStack_180 = (CodeBuilder *)0x13302b;
          translate();
LAB_0013302b:
          pCStack_180 = (CodeBuilder *)0x133030;
          translate();
LAB_00133030:
          pCStack_180 = (CodeBuilder *)0x133035;
          translate();
LAB_00133035:
          pCStack_180 = (CodeBuilder *)0x13303a;
          translate();
          unaff_R12 = pCVar22;
LAB_0013303a:
          pCStack_180 = (CodeBuilder *)0x13303f;
          translate();
LAB_0013303f:
          pCStack_180 = (CodeBuilder *)0x133044;
          translate();
LAB_00133044:
          pCStack_180 = (CodeBuilder *)X86RAPass_translateJump;
          translate();
          pCVar7 = (((X86RAPass *)this_01)->super_RAPass).super_CBPass._cb;
          node_00 = (((((X86RAPass *)this_01)->super_RAPass)._func)->_end->super_CBNode)._prev;
          pXStack_1c8 = (X86RAPass *)0x133080;
          pXStack_1a8 = this;
          pCStack_1a0 = unaff_R12;
          pCStack_198 = node_02;
          pCStack_190 = pCVar23;
          pCStack_188 = unaff_R15;
          pCStack_180 = pCVar20;
          pCVar16 = CodeBuilder::setCursor(pCVar7,node_00);
          pXStack_1c8 = (X86RAPass *)0x133095;
          (*(code *)(((X86RAPass *)(((X86RAPass *)this_01)->super_RAPass).super_CBPass._vptr_CBPass)
                    ->super_RAPass)._heap._slots[3])
                    (this_01,*(undefined8 *)(*(long *)(extraout_RDX + 0x20) + 8));
          if (pCVar7->_cursor != node_00) {
            pXStack_1c8 = (X86RAPass *)0x1330ae;
            uVar24 = extraout_XMM1_Qa;
            pCStack_1c0 = pCVar16;
            node_01 = (CodeCompiler *)CodeBuilder::newLabelNode(pCVar7);
            aStack_1b8._packed[0] = (UInt64)((ulong)*(uint *)(extraout_RDX + 0x28) << 0x20 | 4);
            aStack_1b8._mem.field_2.offset64 = (anon_union_8_2_78723da6_for_MemData_2)0x0;
            pXStack_1c8 = (X86RAPass *)0x1330db;
            CodeEmitter::emit(&pCVar7->super_CodeEmitter,0x11e,(Operand_ *)&aStack_1b8._any);
            pCVar7->_cursor = node_00;
            pXStack_1c8 = (X86RAPass *)0x1330ed;
            this_00 = node_01;
            pCVar20 = pCVar7;
            CodeBuilder::addNode(pCVar7,(CBNode *)node_01);
            bVar4 = (((CBInst *)&in_RSI->super_CBLabel)->super_CBNode)._opCount;
            if (bVar4 == 0) {
              pXStack_1c8 = (X86RAPass *)0x133153;
              X86RAPass_translateJump();
              _Stack_298.reg_save_area = auStack_278;
              if (extraout_AL != '\0') {
                uStack_238 = uVar24;
              }
              _Stack_298.overflow_arg_area = &aStack_1b8;
              _Stack_298.gp_offset = 0x20;
              _Stack_298.fp_offset = 0x30;
              uStack_258 = in_R8;
              uStack_250 = in_R9;
              pXStack_1c8 = (X86RAPass *)this_01;
              CodeCompiler::_newReg(this_00,(Reg *)pCVar20,typeId,in_RCX,&_Stack_298);
              return (Error)pCVar20;
            }
            uVar18._0_1_ = (node_01->super_CodeBuilder).super_CodeEmitter._type;
            uVar18._1_1_ = (node_01->super_CodeBuilder).super_CodeEmitter._destroyed;
            uVar18._2_1_ = (node_01->super_CodeBuilder).super_CodeEmitter._finalized;
            uVar18._3_1_ = (node_01->super_CodeBuilder).super_CodeEmitter._reserved;
            RVar8 = (in_RSI->_funcDetail)._callConv._passedOrder[0];
            uVar17 = (ulong)(bVar4 - 1);
            *(ulong *)((long)RVar8 + uVar17 * 0x10) = (ulong)uVar18 << 0x20 | 4;
            *(undefined8 *)((long)RVar8 + uVar17 * 0x10 + 8) = 0;
            *(CodeCompiler **)(in_RSI->_funcDetail)._callConv._passedOrder[1].id = node_01;
            puVar2 = &((CBInst *)&in_RSI->super_CBLabel)->_options;
            *(byte *)puVar2 = (byte)*puVar2 & 0xbf;
            pCVar16 = pCStack_1c0;
          }
          pCVar7->_cursor = pCVar16;
          pXStack_1c8 = (X86RAPass *)0x13313f;
          EVar13 = (*(code *)(((X86RAPass *)
                              (((X86RAPass *)this_01)->super_RAPass).super_CBPass._vptr_CBPass)->
                             super_RAPass)._heap._slots[1])
                             (this_01,*(undefined8 *)
                                       ((long)(((CBInst *)&in_RSI->super_CBLabel)->super_CBNode).
                                              _passData + 8));
          return EVar13;
        }
        in_R8 = (ulong)(uVar12 - 0x100);
        uVar17._0_4_ = pCVar7[1].super_CodeEmitter._privateData;
        uVar17._4_4_ = pCVar7[1].super_CodeEmitter._globalHints;
        if (uVar17 <= in_R8) goto LAB_0013302b;
        in_R9 = *(ulong *)&pCVar7[1].super_CodeEmitter._type;
        in_R8 = *(ulong *)(in_R9 + in_R8 * 8);
        if (in_R8 == 0) goto LAB_00133030;
        in_R8 = *(ulong *)(in_R8 + 0x28);
        if (in_R8 == 0) goto LAB_00133035;
        uVar12 = (pCVar7->super_CodeEmitter)._nativeGpReg.super_Operand.super_Operand_.field_0._any.
                 signature & 0xf8;
        in_R9 = (ulong)uVar12;
        bVar4 = this->_varBaseRegId;
        *(uint *)&(((CBInst *)&in_RSI->super_CBLabel)->super_CBNode)._prev =
             uVar18 & 0xffffff07 | uVar12;
        *(uint *)((long)&(((CBInst *)&in_RSI->super_CBLabel)->super_CBNode)._next + 4) = (uint)bVar4
        ;
        ppCVar1 = &(((CBInst *)&in_RSI->super_CBLabel)->super_CBNode)._next;
        *(int *)ppCVar1 = *(int *)ppCVar1 + *(int *)(in_R8 + 8) + this->_varBaseOffset;
        *(uint *)&(((CBInst *)&in_RSI->super_CBLabel)->super_CBNode)._prev =
             uVar18 & 0xffff7f07 | uVar12;
      }
    }
  }
  pCVar15 = (CCFunc *)(((CBInst *)&pCVar15->super_CBLabel)->super_CBNode)._next;
  if (pCVar15 == local_148) {
    pCVar20->_cursor = (CBNode *)pCVar23;
    pCStack_180 = (CodeBuilder *)0x132fda;
    EVar13 = FuncUtils::emitProlog
                       (&((this->super_RAPass).super_CBPass._cb)->super_CodeEmitter,
                        (FuncFrameLayout *)&local_130._any);
    if (EVar13 == 0) {
      pCVar20->_cursor = &pCVar23->_exitNode->super_CBNode;
      pCStack_180 = (CodeBuilder *)0x132ffe;
      EVar13 = FuncUtils::emitEpilog
                         (&((this->super_RAPass).super_CBPass._cb)->super_CodeEmitter,
                          (FuncFrameLayout *)&local_130._any);
    }
    local_174 = EVar13;
    return local_174;
  }
  goto LAB_00132eeb;
LAB_00132bb6:
  pCVar22 = (CCFunc *)&(((CBInst *)&pCVar22->super_CBLabel)->super_CBNode)._inlineComment;
  if (pCVar20 == (CodeBuilder *)pCVar22) goto joined_r0x00132bd3;
  goto LAB_00132aea;
LAB_00132d61:
  (local_158->_x86State).field_0._list[5] = (VirtReg *)node_02;
  local_130._packed[0] = (UInt64)((ulong)local_160->_id << 0x20 | 4);
  local_130._mem.field_2.offset64 = (anon_union_8_2_78723da6_for_MemData_2)0x0;
  in_RSI = (CCFunc *)0x11e;
  pCStack_180 = (CodeBuilder *)0x132d9a;
  CodeEmitter::emit((CodeEmitter *)local_158,0x11e,(Operand_ *)&local_130._any);
LAB_00132d9a:
  uVar18 = 0;
  bVar9 = true;
LAB_00132d9e:
  if (!bVar9) {
    local_174 = uVar18;
  }
  in_RCX = (char *)(ulong)local_174;
  if (!bVar9) {
    return local_174;
  }
switchD_00132997_caseD_1:
  pCVar22 = unaff_R12;
  node_02 = unaff_R12;
  if (unaff_R12 != local_148) goto LAB_00132925;
  goto switchD_00132997_caseD_7;
}

Assistant:

Error X86RAPass::translate() {
  X86Compiler* cc = this->cc();
  CCFunc* func = getFunc();

  // Register allocator contexts.
  X86VarAlloc vAlloc(this);
  X86CallAlloc cAlloc(this);

  // Flow.
  CBNode* node_ = func;
  CBNode* next = nullptr;
  CBNode* stop = getStop();

  ZoneList<CBNode*>::Link* jLink = _jccList.getFirst();

  for (;;) {
    while (node_->isTranslated()) {
      // Switch state if we went to a node that is already translated.
      if (node_->getType() == CBNode::kNodeLabel) {
        CBLabel* node = static_cast<CBLabel*>(node_);
        cc->_setCursor(node->getPrev());
        switchState(node->getPassData<RAData>()->state);
      }

_NextGroup:
      if (!jLink) {
        goto _Done;
      }
      else {
        node_ = jLink->getValue();
        jLink = jLink->getNext();

        CBNode* jFlow = X86RAPass_getOppositeJccFlow(static_cast<CBJump*>(node_));
        loadState(node_->getPassData<RAData>()->state);

        if (jFlow->hasPassData() && jFlow->getPassData<RAData>()->state) {
          X86RAPass_translateJump(this, static_cast<CBJump*>(node_), static_cast<CBLabel*>(jFlow));

          node_ = jFlow;
          if (node_->isTranslated())
            goto _NextGroup;
        }
        else {
          node_ = jFlow;
        }

        break;
      }
    }

    next = node_->getNext();
    node_->_flags |= CBNode::kFlagIsTranslated;

    if (node_->hasPassData()) {
      switch (node_->getType()) {
        // --------------------------------------------------------------------
        // [Align / Embed]
        // --------------------------------------------------------------------

        case CBNode::kNodeAlign:
        case CBNode::kNodeData:
          break;

        // --------------------------------------------------------------------
        // [Label]
        // --------------------------------------------------------------------

        case CBNode::kNodeLabel: {
          CBLabel* node = static_cast<CBLabel*>(node_);
          ASMJIT_ASSERT(node->getPassData<RAData>()->state == nullptr);
          node->getPassData<RAData>()->state = saveState();

          if (node == func->getExitNode())
            goto _NextGroup;
          break;
        }

        // --------------------------------------------------------------------
        // [Inst/Call/SArg/Ret]
        // --------------------------------------------------------------------

        case CBNode::kNodeInst:
        case CBNode::kNodeFunc:
        case CBNode::kNodeFuncCall:
        case CBNode::kNodePushArg:
          // Update TiedReg's unuse flags based on liveness of the next node.
          if (!node_->isJcc()) {
            X86RAData* raData = node_->getPassData<X86RAData>();
            RABits* liveness;

            if (raData && next && next->hasPassData() && (liveness = next->getPassData<RAData>()->liveness)) {
              TiedReg* tiedArray = raData->tiedArray;
              uint32_t tiedTotal = raData->tiedTotal;

              for (uint32_t i = 0; i < tiedTotal; i++) {
                TiedReg* tied = &tiedArray[i];
                VirtReg* vreg = tied->vreg;

                if (!liveness->getBit(vreg->_raId) && !vreg->isFixed())
                  tied->flags |= TiedReg::kUnuse;
              }
            }
          }

          if (node_->getType() == CBNode::kNodeFuncCall) {
            ASMJIT_PROPAGATE(cAlloc.run(static_cast<CCFuncCall*>(node_)));
            break;
          }
          ASMJIT_FALLTHROUGH;

        case CBNode::kNodeHint:
        case CBNode::kNodeFuncExit: {
          ASMJIT_PROPAGATE(vAlloc.run(node_));

          // Handle conditional/unconditional jump.
          if (node_->isJmpOrJcc()) {
            CBJump* node = static_cast<CBJump*>(node_);
            CBLabel* jTarget = node->getTarget();

            // Target not followed.
            if (!jTarget) {
              if (node->isJmp())
                goto _NextGroup;
              else
                break;
            }

            if (node->isJmp()) {
              if (jTarget->hasPassData() && jTarget->getPassData<RAData>()->state) {
                cc->_setCursor(node->getPrev());
                switchState(jTarget->getPassData<RAData>()->state);

                goto _NextGroup;
              }
              else {
                next = jTarget;
              }
            }
            else {
              CBNode* jNext = node->getNext();

              if (jTarget->isTranslated()) {
                if (jNext->isTranslated()) {
                  ASMJIT_ASSERT(jNext->getType() == CBNode::kNodeLabel);
                  cc->_setCursor(node->getPrev());
                  intersectStates(
                    jTarget->getPassData<RAData>()->state,
                    jNext->getPassData<RAData>()->state);
                }

                RAState* savedState = saveState();
                node->getPassData<RAData>()->state = savedState;

                X86RAPass_translateJump(this, node, jTarget);
                next = jNext;
              }
              else if (jNext->isTranslated()) {
                ASMJIT_ASSERT(jNext->getType() == CBNode::kNodeLabel);

                RAState* savedState = saveState();
                node->getPassData<RAData>()->state = savedState;

                cc->_setCursor(node);
                switchState(jNext->getPassData<RAData>()->state);
                next = jTarget;
              }
              else {
                node->getPassData<RAData>()->state = saveState();
                next = X86RAPass_getJccFlow(node);
              }
            }
          }
          else if (node_->isRet()) {
            ASMJIT_PROPAGATE(
              X86RAPass_translateRet(this, static_cast<CCFuncRet*>(node_), func->getExitNode()));
          }
          break;
        }

        // --------------------------------------------------------------------
        // [End]
        // --------------------------------------------------------------------

        case CBNode::kNodeSentinel: {
          goto _NextGroup;
        }

        default:
          break;
      }
    }

    if (next == stop)
      goto _NextGroup;
    node_ = next;
  }

_Done:
  {
    ASMJIT_PROPAGATE(resolveCellOffsets());
    ASMJIT_PROPAGATE(X86RAPass_prepareFuncFrame(this, func));

    FuncFrameLayout layout;
    ASMJIT_PROPAGATE(layout.init(func->getDetail(), func->getFrameInfo()));

    _varBaseRegId = layout._stackBaseRegId;
    _varBaseOffset = layout._stackBaseOffset;

    ASMJIT_PROPAGATE(X86RAPass_patchFuncMem(this, func, stop, layout));

    cc->_setCursor(func);
    ASMJIT_PROPAGATE(FuncUtils::emitProlog(this->cc(), layout));

    cc->_setCursor(func->getExitNode());
    ASMJIT_PROPAGATE(FuncUtils::emitEpilog(this->cc(), layout));
  }

  return kErrorOk;
}